

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVisualShapeFEA.cpp
# Opt level: O2

void chrono::TriangleNormalsCompute
               (ChVector<int> *norm_indexes,ChVector<int> *vert_indexes,
               vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
               *vertexes,
               vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *normals
               ,vector<int,_std::allocator<int>_> *accumul)

{
  int iVar1;
  int iVar2;
  pointer pCVar3;
  pointer piVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  ChVector<double> result;
  ChVector<double> tnorm;
  undefined1 local_58 [16];
  double local_48;
  ChVector<double> local_38;
  
  iVar1 = vert_indexes->m_data[0];
  iVar2 = vert_indexes->m_data[2];
  pCVar3 = (vertexes->
           super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = pCVar3[iVar1].m_data[0];
  auVar12._8_8_ = pCVar3[iVar1].m_data[2];
  auVar12._0_8_ = pCVar3[iVar1].m_data[2];
  auVar5 = vsubpd_avx(*(undefined1 (*) [16])(pCVar3[vert_indexes->m_data[1]].m_data + 1),
                      *(undefined1 (*) [16])(pCVar3[iVar1].m_data + 1));
  auVar10._8_8_ = 0;
  auVar10._0_8_ = pCVar3[iVar2].m_data[2];
  auVar8 = vunpcklpd_avx(auVar12,auVar7);
  auVar7 = vmovhpd_avx(auVar10,pCVar3[iVar2].m_data[0]);
  auVar8 = vsubpd_avx(auVar7,auVar8);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = pCVar3[vert_indexes->m_data[1]].m_data[0] - pCVar3[iVar1].m_data[0];
  auVar7 = vshufpd_avx(auVar5,auVar6,1);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = pCVar3[iVar2].m_data[1] -
                 SUB168(*(undefined1 (*) [16])(pCVar3[iVar1].m_data + 1),0);
  auVar10 = vunpcklpd_avx(auVar9,auVar8);
  auVar11._0_8_ = auVar10._0_8_ * auVar7._0_8_;
  auVar11._8_8_ = auVar10._8_8_ * auVar7._8_8_;
  local_58 = vfmsub231pd_fma(auVar11,auVar5,auVar8);
  auVar7 = vshufpd_avx(auVar8,auVar8,1);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = auVar7._0_8_ * auVar5._0_8_;
  auVar7 = vfmsub231sd_fma(auVar8,auVar6,auVar9);
  local_48 = auVar7._0_8_;
  ChVector<double>::GetNormalized(&local_38,(ChVector<double> *)local_58);
  ChVector<double>::operator+=
            ((normals->
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             )._M_impl.super__Vector_impl_data._M_start + norm_indexes->m_data[0],&local_38);
  ChVector<double>::operator+=
            ((normals->
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             )._M_impl.super__Vector_impl_data._M_start + norm_indexes->m_data[1],&local_38);
  ChVector<double>::operator+=
            ((normals->
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             )._M_impl.super__Vector_impl_data._M_start + norm_indexes->m_data[2],&local_38);
  piVar4 = (accumul->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar4[norm_indexes->m_data[0]] = piVar4[norm_indexes->m_data[0]] + 1;
  piVar4[norm_indexes->m_data[1]] = piVar4[norm_indexes->m_data[1]] + 1;
  piVar4[norm_indexes->m_data[2]] = piVar4[norm_indexes->m_data[2]] + 1;
  return;
}

Assistant:

void TriangleNormalsCompute(ChVector<int> norm_indexes,
                            ChVector<int> vert_indexes,
                            std::vector<ChVector<>>& vertexes,
                            std::vector<ChVector<>>& normals,
                            std::vector<int>& accumul) {
    ChVector<> tnorm = Vcross(vertexes[vert_indexes.y()] - vertexes[vert_indexes.x()],
                              vertexes[vert_indexes.z()] - vertexes[vert_indexes.x()])
                           .GetNormalized();
    normals[norm_indexes.x()] += tnorm;
    normals[norm_indexes.y()] += tnorm;
    normals[norm_indexes.z()] += tnorm;
    accumul[norm_indexes.x()] += 1;
    accumul[norm_indexes.y()] += 1;
    accumul[norm_indexes.z()] += 1;
}